

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflenetv2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  char *pcVar1;
  int *piVar2;
  _func_int **__first;
  char cVar3;
  Layer *pLVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  vector<float,_std::allocator<float>_> cls_scores;
  Extractor ex;
  Mat local_1a8;
  ParamDict pd;
  size_t local_150;
  Allocator *local_140;
  int iStack_134;
  Net shufflenetv2;
  Mat local_c8;
  float norm_vals [3];
  Mat m;
  int local_68;
  int local_64;
  uchar *local_60;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&shufflenetv2,pcVar1,(allocator *)&local_c8);
    cv::imread((string *)&m,(int)&shufflenetv2);
    if ((Allocator **)shufflenetv2._vptr_Net != &shufflenetv2.opt.blob_allocator) {
      operator_delete(shufflenetv2._vptr_Net);
    }
    cVar3 = cv::Mat::empty();
    if (cVar3 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&shufflenetv2);
      shufflenetv2.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&shufflenetv2,"shufflenet_v2_x0.5.param");
      ncnn::Net::load_model(&shufflenetv2,"shufflenet_v2_x0.5.bin");
      ncnn::Mat::from_pixels_resize
                (&local_c8,local_60,2,local_64,local_68,0xe0,0xe0,(Allocator *)0x0);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&local_c8,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&local_c8);
      local_1a8.cstep = 0;
      local_1a8.data = (Allocator *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_1_ = false;
      local_1a8.elemsize._5_1_ = false;
      local_1a8.elemsize._6_1_ = false;
      local_1a8.elemsize._7_1_ = false;
      local_1a8.elempack = 0;
      local_1a8.allocator = (Allocator *)0x0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
      ncnn::Extractor::extract(&ex,"fc",&local_1a8,0);
      pLVar4 = ncnn::create_layer("Softmax");
      ncnn::ParamDict::ParamDict(&pd);
      (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
      (*pLVar4->_vptr_Layer[9])(pLVar4,&local_1a8,&shufflenetv2.opt);
      (*pLVar4->_vptr_Layer[1])(pLVar4);
      ncnn::ParamDict::~ParamDict(&pd);
      ncnn::Mat::reshape((Mat *)&pd,&local_1a8,local_1a8.h * local_1a8.w * local_1a8.c,
                         (Allocator *)0x0);
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
              free(local_1a8.data);
            }
          }
          else {
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1a8.data = pd._vptr_ParamDict;
      local_1a8.refcount._0_4_ = SUB84(pd.d,0);
      local_1a8.refcount._4_4_ = (undefined4)((ulong)pd.d >> 0x20);
      local_1a8.elemsize._0_4_ = (int)local_150;
      local_1a8.elemsize._4_4_ = (undefined4)(local_150 >> 0x20);
      local_1a8.allocator = local_140;
      local_1a8.w = iStack_134;
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type == 0) {
          if (local_140 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_140->_vptr_Allocator[3])();
          }
        }
      }
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_1a8.w);
      if (0 < (long)local_1a8.w) {
        lVar7 = 0;
        do {
          cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] =
               *(float *)((long)(_func_int ***)local_1a8.data + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (local_1a8.w != lVar7);
      }
      piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
              free(local_1a8.data);
            }
          }
          else {
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&shufflenetv2);
      shufflenetv2._vptr_Net = (_func_int **)0x0;
      shufflenetv2.opt.lightmode = false;
      shufflenetv2.opt._1_3_ = 0;
      shufflenetv2.opt.num_threads = 0;
      shufflenetv2.opt.blob_allocator = (Allocator *)0x0;
      uVar8 = (uint)((ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &shufflenetv2,(long)(int)uVar8);
      __first = shufflenetv2._vptr_Net;
      if (0 < (int)uVar8) {
        uVar5 = 0;
        do {
          *(float *)(shufflenetv2._vptr_Net + uVar5) =
               cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          *(int *)((long)shufflenetv2._vptr_Net + uVar5 * 8 + 4) = (int)uVar5;
          uVar5 = uVar5 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar5);
      }
      __last._M_current = (pair<float,_int> *)(shufflenetv2._vptr_Net + 3);
      std::
      __heap_select<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (shufflenetv2._vptr_Net,__last._M_current,shufflenetv2.opt._0_8_);
      std::
      __sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__first,__last,
                 (_Iter_comp_iter<std::greater<std::pair<float,_int>_>_> *)&local_c8);
      main_cold_2();
      iVar6 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar6 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_shufflenetv2(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}